

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main3.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  reference pvVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  uint *puVar5;
  vector<double,_std::allocator<double>_> *in_RSI;
  undefined4 in_EDI;
  double dVar6;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  int i;
  uint i_2;
  int i_1;
  double dist;
  int k;
  vector<double,_std::allocator<double>_> distsGraph;
  vector<double,_std::allocator<double>_> maxVector;
  vector<int,_std::allocator<int>_> backPoints;
  int dstPix;
  int seedPixs [1];
  int numSeedPixs;
  KMaxDistance kmax;
  Graph g;
  Graph *in_stack_fffffffffffffed0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffee0;
  Graph *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  Graph *in_stack_ffffffffffffff00;
  int local_d4;
  uint local_d0;
  int local_cc;
  vector<double,_std::allocator<double>_> local_b8;
  vector<double,_std::allocator<double>_> local_a0;
  vector<int,_std::allocator<int>_> local_88;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  Graph *in_stack_ffffffffffffffd0;
  KMaxDistance *in_stack_ffffffffffffffd8;
  undefined4 uVar7;
  int iVar8;
  
  uVar7 = 0;
  Graph::Graph(in_stack_fffffffffffffed0);
  Graph::addNode(in_stack_ffffffffffffff00);
  Graph::addNode(in_stack_ffffffffffffff00);
  Graph::addNode(in_stack_ffffffffffffff00);
  Graph::addNode(in_stack_ffffffffffffff00);
  Graph::addNode(in_stack_ffffffffffffff00);
  Graph::addNode(in_stack_ffffffffffffff00);
  Graph::addEdge(in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                 (int)in_stack_fffffffffffffef8,(double)in_stack_fffffffffffffef0);
  Graph::addEdge(in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                 (int)in_stack_fffffffffffffef8,(double)in_stack_fffffffffffffef0);
  Graph::addEdge(in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                 (int)in_stack_fffffffffffffef8,(double)in_stack_fffffffffffffef0);
  Graph::addEdge(in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                 (int)in_stack_fffffffffffffef8,(double)in_stack_fffffffffffffef0);
  Graph::addEdge(in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                 (int)in_stack_fffffffffffffef8,(double)in_stack_fffffffffffffef0);
  Graph::addEdge(in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                 (int)in_stack_fffffffffffffef8,(double)in_stack_fffffffffffffef0);
  Graph::printInfo(in_stack_fffffffffffffef0);
  KMaxDistance::KMaxDistance((KMaxDistance *)&stack0xffffffffffffffa0);
  local_64 = 1;
  local_68 = 0;
  local_6c = 5;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10744e);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x107460);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x107472);
  dVar6 = KMaxDistance::compute
                    (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                     in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                     in_RSI,(vector<int,_std::allocator<int>_> *)CONCAT44(uVar7,in_EDI),
                     unaff_retaddr);
  printf("Distance: %.3f\n",dVar6);
  printf("Max vector: ( ");
  for (local_cc = 0; local_cc < 2; local_cc = local_cc + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&local_a0,(long)local_cc);
    printf("%.3f ",*pvVar1);
  }
  printf(")\n");
  printf("Distances to nodes:\n");
  local_d0 = 0;
  while( true ) {
    uVar2 = (ulong)local_d0;
    sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_b8);
    if (sVar3 <= uVar2) break;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&local_b8,(ulong)local_d0);
    printf("Distance to node %d: %.3f\n",*pvVar1,(ulong)local_d0);
    local_d0 = local_d0 + 1;
  }
  printf("Backtracking:\n");
  local_d4 = 0;
  while( true ) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_88,(long)local_d4);
    if (*pvVar4 == -1) break;
    sVar3 = (size_type)local_d4;
    local_d4 = local_d4 + 1;
    puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&local_88,sVar3);
    printf("%d ",(ulong)*puVar5);
  }
  printf("\n");
  iVar8 = 0;
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffee0);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffee0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee0);
  Graph::~Graph((Graph *)0x1076d9);
  return iVar8;
}

Assistant:

int main( int argc, char** argv )
{
    Graph g;
	g.addNode();
	g.addNode();
	g.addNode();
	g.addNode();
	g.addNode();
	g.addNode();
	g.addEdge(0, 1, 0.4);
	g.addEdge(1, 2, 0.3);
	g.addEdge(2, 4, 0.2);
	g.addEdge(0, 3, 0.5);
	g.addEdge(3, 4, 0.1);
	g.addEdge(4, 5, 0.3);
	g.printInfo();
	 
    KMaxDistance kmax;
    
    const int numSeedPixs = 1;
    int seedPixs[numSeedPixs];
    seedPixs[0] = 0;
    int dstPix = 5;
    
    std::vector<int> backPoints;
    std::vector<double> maxVector;
    std::vector<double> distsGraph;
    int k = 2;
    
    double dist = kmax.compute(g, k, seedPixs, numSeedPixs, -dstPix, &distsGraph, &backPoints, &maxVector);
    printf("Distance: %.3f\n", dist);
    
    printf("Max vector: ( "); 
    for(int i = 0; i < k; i++) printf("%.3f ", maxVector[i]);
    printf(")\n");
    
    printf("Distances to nodes:\n");
	for (unsigned int i = 0; i < distsGraph.size(); i++)
	{
		printf("Distance to node %d: %.3f\n", i, distsGraph[i]);
	}
   
    printf("Backtracking:\n");
    int i = 0;
    while(backPoints[i] != -1)
    {
		printf("%d ", backPoints[i++]);
	}
	printf("\n");
    
    return 0;
}